

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::StringTrieBuilder::LinearMatchNode::operator==(LinearMatchNode *this,Node *other)

{
  UBool UVar1;
  bool local_31;
  LinearMatchNode *o;
  Node *other_local;
  LinearMatchNode *this_local;
  
  if (this == (LinearMatchNode *)other) {
    this_local._7_1_ = true;
  }
  else {
    UVar1 = ValueNode::operator==(&this->super_ValueNode,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = false;
    }
    else {
      local_31 = false;
      if (this->length == other[1].hash) {
        local_31 = this->next == (Node *)other[2].super_UObject._vptr_UObject;
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
StringTrieBuilder::LinearMatchNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!ValueNode::operator==(other)) {
        return FALSE;
    }
    const LinearMatchNode &o=(const LinearMatchNode &)other;
    return length==o.length && next==o.next;
}